

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S_Superellipsoid.cpp
# Opt level: O0

Point3 * __thiscall
sch::S_Superellipsoid::l_Support
          (Point3 *__return_storage_ptr__,S_Superellipsoid *this,Vector3 *v,int *param_2)

{
  double *pdVar1;
  double *pdVar2;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  size_t *siglen_03;
  size_t *siglen_04;
  uchar *puVar3;
  EVP_PKEY_CTX *pEVar4;
  size_t in_R8;
  double extraout_XMM0_Qa;
  double dVar5;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  Scalar cte;
  Scalar ste;
  Scalar ct2e;
  Scalar st2e;
  Scalar st2;
  double local_b8;
  double local_b0;
  double local_a8;
  Scalar tp2;
  Scalar tp1;
  double local_90;
  double local_88;
  double local_80;
  Scalar ct2;
  Scalar tt2;
  Scalar tt1;
  Scalar cpe;
  Scalar spe;
  Scalar cp2e;
  Scalar sp2e;
  Scalar sp2;
  Scalar cp2;
  Scalar cnz;
  Scalar bny;
  Scalar anx;
  int *param_2_local;
  Vector3 *v_local;
  S_Superellipsoid *this_local;
  
  dVar5 = this->a_;
  anx = (Scalar)param_2;
  param_2_local = (int *)v;
  v_local = (Vector3 *)this;
  pdVar1 = CD_Matrix::Vector3T<double,_false>::operator[](v,0);
  bny = dVar5 * ABS(*pdVar1);
  dVar5 = this->b_;
  pdVar1 = CD_Matrix::Vector3T<double,_false>::operator[]
                     ((Vector3T<double,_false> *)param_2_local,1);
  cnz = dVar5 * ABS(*pdVar1);
  dVar5 = this->c_;
  pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[]
                     ((Vector3T<double,_false> *)param_2_local,2);
  cp2 = dVar5 * ABS(*pdVar2);
  if ((bny != 0.0) || (NAN(bny))) {
    tp2 = cnz / bny;
    local_a8 = pow(tp2,this->_2on2_e2);
    sp2 = 1.0 / (local_a8 + 1.0);
    if ((sp2 != 1.0) || (NAN(sp2))) {
      sp2e = 1.0 - sp2;
      cp2e = pow(sp2e,this->_2_e2on2);
      spe = cp2e / tp2;
      cpe = sp2e / cp2e;
      tt1 = sp2 / spe;
      tt2 = (cp2 * cp2e) / cnz;
    }
    else {
      sp2e = 0.0;
      spe = 1.0;
      cp2e = 0.0;
      tt1 = 1.0;
      cpe = 0.0;
      tt2 = cp2 / bny;
    }
  }
  else {
    if ((cnz == 0.0) && (!NAN(cnz))) {
      local_88 = 0.0;
      local_90 = 0.0;
      dVar5 = this->c_;
      puVar3 = (uchar *)0x2;
      pEVar4 = (EVP_PKEY_CTX *)param_2_local;
      CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)param_2_local,2);
      sign(pEVar4,puVar3,siglen,(uchar *)pdVar1,in_R8);
      tp1 = dVar5 * extraout_XMM0_Qa;
      CD_Matrix::Vector3T<double,_false>::Vector3T(__return_storage_ptr__,&local_88,&local_90,&tp1);
      return __return_storage_ptr__;
    }
    sp2 = 0.0;
    sp2e = 1.0;
    spe = 0.0;
    cp2e = 1.0;
    tt1 = 0.0;
    cpe = 1.0;
    tt2 = cp2 / cnz;
  }
  ct2 = pow(tt2,this->_2on2_e1);
  local_80 = 1.0 / (ct2 + 1.0);
  if ((local_80 != 1.0) || (NAN(local_80))) {
    st2e = 1.0 - local_80;
    ct2e = pow(st2e,this->_2_e1on2);
    ste = ct2e / tt2;
    cte = st2e / ct2e;
    local_e8 = local_80 / ste;
    dVar5 = this->a_ * local_e8 * tt1;
    puVar3 = (uchar *)0x0;
    pEVar4 = (EVP_PKEY_CTX *)param_2_local;
    CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)param_2_local,0);
    sign(pEVar4,puVar3,siglen_02,(uchar *)pdVar1,in_R8);
    local_f0 = dVar5 * extraout_XMM0_Qa_02;
    dVar5 = this->b_ * local_e8 * cpe;
    puVar3 = (uchar *)0x1;
    pEVar4 = (EVP_PKEY_CTX *)param_2_local;
    CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)param_2_local,1);
    sign(pEVar4,puVar3,siglen_03,(uchar *)pdVar1,in_R8);
    local_f8 = dVar5 * extraout_XMM0_Qa_03;
    dVar5 = this->c_ * cte;
    puVar3 = (uchar *)0x2;
    pEVar4 = (EVP_PKEY_CTX *)param_2_local;
    CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)param_2_local,2);
    sign(pEVar4,puVar3,siglen_04,(uchar *)pdVar1,in_R8);
    local_100 = dVar5 * extraout_XMM0_Qa_04;
    CD_Matrix::Vector3T<double,_false>::Vector3T
              (__return_storage_ptr__,&local_f0,&local_f8,&local_100);
  }
  else {
    dVar5 = this->a_ * tt1;
    puVar3 = (uchar *)0x0;
    pEVar4 = (EVP_PKEY_CTX *)param_2_local;
    CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)param_2_local,0);
    sign(pEVar4,puVar3,siglen_00,(uchar *)pdVar1,in_R8);
    local_b0 = dVar5 * extraout_XMM0_Qa_00;
    dVar5 = this->b_ * cpe;
    puVar3 = (uchar *)0x1;
    pEVar4 = (EVP_PKEY_CTX *)param_2_local;
    CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)param_2_local,1);
    sign(pEVar4,puVar3,siglen_01,(uchar *)pdVar1,in_R8);
    local_b8 = dVar5 * extraout_XMM0_Qa_01;
    st2 = 0.0;
    CD_Matrix::Vector3T<double,_false>::Vector3T(__return_storage_ptr__,&local_b0,&local_b8,&st2);
  }
  return __return_storage_ptr__;
}

Assistant:

Point3 S_Superellipsoid::l_Support(const Vector3 & v, int & /*lastFeature*/) const
{
  Scalar anx, bny, cnz;

  anx = a_ * fabs(v[0]);
  bny = b_ * fabs(v[1]);
  cnz = c_ * fabs(v[2]);

  Scalar cp2, sp2, sp2e, cp2e, spe, cpe, tt1, tt2, ct2;

  if(anx == 0)
  {
    if(bny == 0)
    {
      return Point3(0, 0, c_ * sign(v[2]));
    }
    else
    {
      cp2 = 0;
      sp2 = 1;
      cp2e = 0;
      sp2e = 1;
      cpe = 0;
      spe = 1;
      tt1 = cnz / bny;
    }
  }
  else
  {
    Scalar tp1 = bny / anx;
    Scalar tp2 = pow(tp1, _2on2_e2);
    cp2 = 1 / (tp2 + 1);

    if(cp2 == 1)
    {
      sp2 = 0;
      cp2e = 1;
      sp2e = 0;
      cpe = 1;
      spe = 0;
      tt1 = cnz / anx;
    }
    else
    {
      sp2 = 1 - cp2;
      sp2e = pow(sp2, _2_e2on2);
      cp2e = sp2e / tp1;
      spe = sp2 / sp2e;
      cpe = cp2 / cp2e;
      tt1 = cnz * sp2e / bny;
    }
  }

  tt2 = pow(tt1, _2on2_e1);
  ct2 = 1 / (tt2 + 1);

  if(ct2 == 1)
  {
    return Point3(a_ * cpe * sign(v[0]), b_ * spe * sign(v[1]), 0);
  }
  else
  {
    Scalar st2 = 1 - ct2;
    Scalar st2e = pow(st2, _2_e1on2);
    Scalar ct2e = st2e / tt1;
    Scalar ste = st2 / st2e;
    Scalar cte = ct2 / ct2e;
    return Point3(a_ * cte * cpe * sign(v[0]), b_ * cte * spe * sign(v[1]), c_ * ste * sign(v[2]));
  }
}